

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
cfg::tag_int_scalar_t<cfgfile::string_trait_t>::tag_int_scalar_t
          (tag_int_scalar_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  byte in_CL;
  tag_scalar_t<int,_cfgfile::string_trait_t> *in_RDI;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  constraint_one_of_t<int> *in_stack_fffffffffffffeb0;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffeb8;
  allocator *value;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_stack_fffffffffffffec0;
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  allocator local_71;
  string local_70 [32];
  string local_50 [55];
  byte local_19;
  
  local_19 = in_CL & 1;
  cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::tag_scalar_t
            ((tag_scalar_t<int,_cfgfile::string_trait_t> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,(string_t *)in_stack_fffffffffffffeb0,
             (bool)in_stack_fffffffffffffeaf);
  (in_RDI->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_int_scalar_t_00179b60;
  cfgfile::constraint_one_of_t<int>::constraint_one_of_t(in_stack_fffffffffffffeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"string_field",&local_71);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (string_t *)in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffeaf);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::constraint_one_of_t
            ((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffeb0);
  local_78 = 100;
  cfgfile::constraint_one_of_t<int>::add_value
            ((constraint_one_of_t<int> *)in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8)
  ;
  local_7c = 200;
  cfgfile::constraint_one_of_t<int>::add_value
            ((constraint_one_of_t<int> *)in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8)
  ;
  local_80 = 300;
  cfgfile::constraint_one_of_t<int>::add_value
            ((constraint_one_of_t<int> *)in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8)
  ;
  cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::set_constraint
            (in_RDI,(constraint_t<int> *)(in_RDI + 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"one",&local_a1);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffec0,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  this_00 = (constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&in_RDI[2].super_tag_t<cfgfile::string_trait_t>.m_line_number;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"two",&local_c9);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  value = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"three",value);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::set_constraint((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                    *)&in_RDI[1].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
                       super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                   (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&in_RDI[2].super_tag_t<cfgfile::string_trait_t>.m_line_number);
  return;
}

Assistant:

tag_int_scalar_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_t< int, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_int_scalar_constraint.add_value( 100 );
		m_int_scalar_constraint.add_value( 200 );
		m_int_scalar_constraint.add_value( 300 );
		this->set_constraint( &m_int_scalar_constraint );

		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}